

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemdbInit(void)

{
  sqlite3_vfs *psVar1;
  uint sz;
  sqlite3_vfs *pLower;
  uint local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  psVar1 = sqlite3_vfs_find((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (psVar1 == (sqlite3_vfs *)0x0) {
    iVar2 = 1;
  }
  else {
    local_14 = psVar1->szOsFile;
    if (local_14 < 0x18) {
      local_14 = 0x18;
    }
    memdb_vfs.szOsFile = local_14;
    memdb_vfs.pAppData = psVar1;
    iVar2 = sqlite3_vfs_register
                      ((sqlite3_vfs *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)psVar1 >> 0x20));
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemdbInit(void){
  sqlite3_vfs *pLower = sqlite3_vfs_find(0);
  unsigned int sz;
  if( NEVER(pLower==0) ) return SQLITE_ERROR;
  sz = pLower->szOsFile;
  memdb_vfs.pAppData = pLower;
  /* The following conditional can only be true when compiled for
  ** Windows x86 and SQLITE_MAX_MMAP_SIZE=0.  We always leave
  ** it in, to be safe, but it is marked as NO_TEST since there
  ** is no way to reach it under most builds. */
  if( sz<sizeof(MemFile) ) sz = sizeof(MemFile); /*NO_TEST*/
  memdb_vfs.szOsFile = sz;
  return sqlite3_vfs_register(&memdb_vfs, 0);
}